

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularBuffer.cpp
# Opt level: O0

int __thiscall JetHead::CircularBuffer::byteAt(CircularBuffer *this,int i)

{
  byte *pbVar1;
  uint8_t *res;
  int size;
  int i_local;
  CircularBuffer *this_local;
  
  res._4_4_ = i;
  _size = this;
  pbVar1 = getBytes(this,i,(int *)&res);
  if (pbVar1 == (byte *)0x0) {
    this_local._4_4_ = 0xffffffff;
  }
  else {
    this_local._4_4_ = (uint)*pbVar1;
  }
  return this_local._4_4_;
}

Assistant:

int	CircularBuffer::byteAt( int i ) const
{
	int size;
	const uint8_t *res = getBytes( i, size );

	if ( res == NULL )
		return -1;
	else
		return *res;
}